

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::append_entries
          (raft_server *this,
          vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          *logs)

{
  bool bVar1;
  size_type sVar2;
  element_type *this_00;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  msg_type *in_RSI;
  element_type *in_RDI;
  ptr<cornerstone::async_result<bool>_> pVar4;
  ptr<async_result<bool>_> pVar5;
  ptr<log_entry> log;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *__range1;
  ptr<req_msg> *in_stack_00000080;
  raft_server *in_stack_00000088;
  ptr<req_msg> req;
  bool result;
  bool *in_stack_ffffffffffffff28;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *this_01;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *args_1;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *in_stack_ffffffffffffff38;
  element_type *args_2;
  unsigned_long *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffff78;
  __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
  local_70;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *local_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  undefined1 local_19;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *local_18;
  
  args_2 = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          ::size(in_RDX);
  if (sVar2 == 0) {
    local_19 = 0;
    pVar4 = cs_new<cornerstone::async_result<bool,std::shared_ptr<std::exception>>,bool&>
                      (in_stack_ffffffffffffff28);
    _Var3 = pVar4.
            super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  else {
    local_38 = 0;
    local_3c = 5;
    local_40 = 0;
    local_44 = 0;
    local_50 = 0;
    local_60._8_8_ = (buffer *)0x0;
    local_60._0_8_ = (_func_void_buffer_ptr *)0x0;
    this_01 = (vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
               *)(local_60 + 8);
    args_1 = (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)local_60;
    cs_new<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              (in_stack_ffffffffffffff58,in_RSI,(int *)args_2,(int *)in_RDI,
               (unsigned_long *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff78);
    local_68 = local_18;
    local_70._M_current =
         (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
         std::
         vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
         ::begin(this_01);
    std::
    vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
    ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
                          *)args_1,
                         (__normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
                          *)this_01);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
      ::operator*(&local_70);
      cs_new<cornerstone::log_entry,int,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
                ((int *)in_stack_ffffffffffffff38,args_1,(log_val_type *)this_01);
      this_00 = std::
                __shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1c088e);
      in_stack_ffffffffffffff38 = req_msg::log_entries(this_00);
      std::
      vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   *)in_RDI,(value_type *)in_stack_ffffffffffffff38);
      std::shared_ptr<cornerstone::log_entry>::~shared_ptr
                ((shared_ptr<cornerstone::log_entry> *)0x1c08b8);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_*,_std::vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>_>
      ::operator++(&local_70);
    }
    send_msg_to_leader(in_stack_00000088,in_stack_00000080);
    std::shared_ptr<cornerstone::req_msg>::~shared_ptr((shared_ptr<cornerstone::req_msg> *)0x1c0917)
    ;
    _Var3._M_pi = extraout_RDX;
  }
  pVar5.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  pVar5.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = args_2;
  return (ptr<async_result<bool>_>)
         pVar5.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::append_entries(std::vector<bufptr>& logs)
{
    if (logs.size() == 0)
    {
        bool result(false);
        return cs_new<async_result<bool>>(result);
    }

    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::client_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    for (auto& item : logs)
    {
        ptr<log_entry> log(cs_new<log_entry>(0, std::move(item), log_val_type::app_log));
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req);
}